

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,FState **state,FState **def,bool *retcode)

{
  uint16_t uVar1;
  FState *pFVar2;
  uint uVar3;
  PClassActor *pPVar4;
  Value *this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  Ch *pCVar5;
  char *name;
  FWriter *pFVar6;
  
  if (retcode != (bool *)0x0) {
    *retcode = false;
  }
  pFVar6 = arc->w;
  if (pFVar6 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 == 4) {
        if (retcode != (bool *)0x0) {
          *retcode = true;
        }
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,0);
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,1);
        *state = (FState *)0x0;
        if (((*(byte *)((long)&this_00->data_ + 0x17) & 4) == 0) ||
           ((*(byte *)((long)&this_01->data_ + 0x16) & 0x40) == 0)) {
          __assert_fail("cls.IsString() && ndx.IsUint()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x79e,
                        "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                       );
        }
        pCVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_00);
        name = UnicodeToString(pCVar5);
        pPVar4 = PClass::FindActor(name);
        if ((pPVar4 != (PClassActor *)0x0) &&
           (uVar3 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(this_01), uVar3 < (uint)pPVar4->NumOwnedStates)) {
          pFVar2 = pPVar4->OwnedStates;
          uVar3 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(this_01);
          *state = pFVar2 + uVar3;
          return arc;
        }
        *state = (FState *)0x0;
        pCVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_00);
        uVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(this_01);
        Printf("\x1cIInvalid state \'%s+%d\' for \'%s\'",pCVar5,(ulong)uVar3,key);
      }
      else if (uVar1 == 0) {
        if (retcode != (bool *)0x0) {
          *retcode = true;
        }
        *state = (FState *)0x0;
      }
      else if (retcode == (bool *)0x0) {
        __assert_fail("false && \"not an array\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x7b6,
                      "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                     );
      }
    }
  }
  else {
    uVar3 = (pFVar6->mInObject).Count;
    if ((((uVar3 == 0) || (def == (FState **)0x0)) ||
        ((pFVar6->mInObject).Array[uVar3 - 1] == false)) || (*state != *def)) {
      if (retcode != (bool *)0x0) {
        *retcode = true;
      }
      FSerializer::WriteKey(arc,key);
      if (*state == (FState *)0x0) {
        pFVar6 = arc->w;
      }
      else {
        pPVar4 = FState::StaticFindStateOwner(*state);
        pFVar6 = arc->w;
        if (pPVar4 != (PClassActor *)0x0) {
          FWriter::StartArray(pFVar6);
          FWriter::String(arc->w,FName::NameData.NameArray
                                 [(pPVar4->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.TypeName.Index].Text);
          FWriter::Uint(arc->w,(uint32_t)(((long)*state - (long)pPVar4->OwnedStates) / 0x28));
          FWriter::EndArray(arc->w);
          return arc;
        }
      }
      FWriter::Null(pFVar6);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FState *&state, FState **def, bool *retcode)
{
	if (retcode) *retcode = false;
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || state != *def)
		{
			if (retcode) *retcode = true;
			arc.WriteKey(key);
			if (state == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				PClassActor *info = FState::StaticFindStateOwner(state);

				if (info != NULL)
				{
					arc.w->StartArray();
					arc.w->String(info->TypeName.GetChars());
					arc.w->Uint((uint32_t)(state - info->OwnedStates));
					arc.w->EndArray();
				}
				else
				{
					arc.w->Null();
				}
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsNull())
			{
				if (retcode) *retcode = true;
				state = nullptr;
			}
			else if (val->IsArray())
			{
				if (retcode) *retcode = true;
				const rapidjson::Value &cls = (*val)[0];
				const rapidjson::Value &ndx = (*val)[1];

				state = nullptr;
				assert(cls.IsString() && ndx.IsUint());
				if (cls.IsString() && ndx.IsUint())
				{
					PClassActor *clas = PClass::FindActor(UnicodeToString(cls.GetString()));
					if (clas && ndx.GetUint() < (unsigned)clas->NumOwnedStates)
					{
						state = clas->OwnedStates + ndx.GetUint();
					}
					else
					{
						// this can actually happen by changing the DECORATE so treat it as a warning, not an error.
						state = nullptr;
						Printf(TEXTCOLOR_ORANGE "Invalid state '%s+%d' for '%s'", cls.GetString(), ndx.GetInt(), key);
					}
				}
				else
				{
					assert(false && "not a state");
					Printf(TEXTCOLOR_RED "data does not represent a state for '%s'", key);
					arc.mErrors++;
				}
			}
			else if (!retcode)
			{
				assert(false && "not an array");
				Printf(TEXTCOLOR_RED "array type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;

}